

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextVkImpl.cpp
# Opt level: O3

void __thiscall
Diligent::DeviceContextVkImpl::CommitDescriptorSets
          (DeviceContextVkImpl *this,ResourceBindInfo *BindInfo,Uint32 CommitSRBMask)

{
  SRBMaskType *pSVar1;
  DescriptorSetInfo *pDVar2;
  byte bVar3;
  uint32_t uVar4;
  PipelineStateVkImpl *this_00;
  ShaderResourceCacheVk *this_01;
  uint32_t *puVar5;
  uint uVar6;
  uint uVar7;
  Uint32 UVar8;
  VkDescriptorSet_T *pVVar9;
  uint uVar10;
  array<Diligent::DeviceContextVkImpl::ResourceBindInfo::DescriptorSetInfo,_8UL> *in_RCX;
  array<Diligent::DeviceContextVkImpl::ResourceBindInfo::DescriptorSetInfo,_8UL> *Args_1;
  VkPipelineLayout pVVar11;
  VkPipelineBindPoint VVar12;
  VkCommandBuffer pVVar13;
  char (*in_R8) [50];
  uint uVar14;
  string msg;
  uint local_64;
  array<Diligent::DeviceContextVkImpl::ResourceBindInfo::DescriptorSetInfo,_8UL> *local_60;
  VkPipelineLayout local_58;
  ResourceBindInfo *local_50;
  uint local_44;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_40;
  array<Diligent::DeviceContextVkImpl::ResourceBindInfo::DescriptorSetInfo,_8UL> *local_38;
  
  if (CommitSRBMask == 0) {
    FormatString<char[65]>
              (&msg,(char (*) [65])
                    "This method should not be called when there is nothing to commit");
    in_RCX = (array<Diligent::DeviceContextVkImpl::ResourceBindInfo::DescriptorSetInfo,_8UL> *)0x1a4
    ;
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"CommitDescriptorSets",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
               ,0x1a4);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)msg._M_dataplus._M_p != &msg.field_2) {
      operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
    }
    uVar14 = 0x20;
    uVar10 = 0x20;
  }
  else {
    uVar10 = 0;
    if (CommitSRBMask != 0) {
      for (; (CommitSRBMask >> uVar10 & 1) == 0; uVar10 = uVar10 + 1) {
      }
    }
    uVar14 = 0x1f;
    if (CommitSRBMask != 0) {
      for (; CommitSRBMask >> uVar14 == 0; uVar14 = uVar14 - 1) {
      }
    }
  }
  this_00 = (this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
            super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_pPipelineState.m_pObject;
  PipelineStateBase<Diligent::EngineVkImplTraits>::CheckPipelineReady
            (&this_00->super_PipelineStateBase<Diligent::EngineVkImplTraits>);
  local_58 = (VkPipelineLayout)CONCAT44(local_58._4_4_,uVar14);
  if ((this_00->super_PipelineStateBase<Diligent::EngineVkImplTraits>).m_SignatureCount <= uVar14) {
    FormatString<char[26],char[57]>
              (&msg,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"LastSign < m_pPipelineState->GetResourceSignatureCount()",
               (char (*) [57])in_RCX);
    in_RCX = (array<Diligent::DeviceContextVkImpl::ResourceBindInfo::DescriptorSetInfo,_8UL> *)0x1a8
    ;
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"CommitDescriptorSets",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
               ,0x1a8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)msg._M_dataplus._M_p != &msg.field_2) {
      operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
    }
  }
  uVar4 = *(uint32_t *)((long)(&(BindInfo->SetInfo)._M_elems[0].vkSets + 1) + (ulong)(uVar10 << 5));
  uVar14 = 0;
  local_60 = (array<Diligent::DeviceContextVkImpl::ResourceBindInfo::DescriptorSetInfo,_8UL> *)0x0;
  local_64 = uVar10;
  local_44 = CommitSRBMask;
  if (uVar10 <= (uint)local_58) {
    local_38 = &BindInfo->SetInfo;
    local_40 = &this->m_DynamicBufferOffsets;
    local_60 = (array<Diligent::DeviceContextVkImpl::ResourceBindInfo::DescriptorSetInfo,_8UL> *)0x0
    ;
    uVar14 = 0;
    local_50 = BindInfo;
    do {
      pDVar2 = local_38->_M_elems + uVar10;
      pVVar9 = local_38->_M_elems[uVar10].vkSets._M_elems[0];
      local_64 = uVar10;
      if (pVVar9 == (VkDescriptorSet_T *)0x0) {
        in_RCX = local_38;
        if ((local_44 >> (uVar10 & 0x1f) & 1) != 0) {
          FormatString<char[131]>
                    (&msg,(char (*) [131])
                          "At least one descriptor set in the stale SRB must not be NULL. Empty SRBs should not be marked as stale by CommitShaderResources()"
                    );
          DebugAssertionFailed
                    (msg._M_dataplus._M_p,"CommitDescriptorSets",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
                     ,0x1b2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)msg._M_dataplus._M_p != &msg.field_2) {
            operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
          }
          pVVar9 = (pDVar2->vkSets)._M_elems[0];
          goto LAB_001d3bdc;
        }
LAB_001d3cca:
        if ((pDVar2->vkSets)._M_elems[1] != (VkDescriptorSet_T *)0x0) {
          FormatString<char[26],char[36]>
                    (&msg,(Diligent *)"Debug expression failed:\n",
                     (char (*) [26])"SetInfo.vkSets[1] == VK_NULL_HANDLE",(char (*) [36])in_RCX);
          in_RCX = (array<Diligent::DeviceContextVkImpl::ResourceBindInfo::DescriptorSetInfo,_8UL> *
                   )0x1b7;
          DebugAssertionFailed
                    (msg._M_dataplus._M_p,"CommitDescriptorSets",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
                     ,0x1b7);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)msg._M_dataplus._M_p != &msg.field_2) {
            operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
          }
        }
      }
      else {
LAB_001d3bdc:
        bVar3 = (BindInfo->super_CommittedShaderResources).ActiveSRBMask;
        in_RCX = (array<Diligent::DeviceContextVkImpl::ResourceBindInfo::DescriptorSetInfo,_8UL> *)
                 (ulong)bVar3;
        if ((bVar3 >> (local_64 & 0x1f) & 1) == 0) {
          if (pVVar9 == (VkDescriptorSet_T *)0x0) goto LAB_001d3cca;
          FormatString<char[48]>
                    (&msg,(char (*) [48])"Descriptor sets must be null for inactive slots");
          in_RCX = (array<Diligent::DeviceContextVkImpl::ResourceBindInfo::DescriptorSetInfo,_8UL> *
                   )0x1b4;
          DebugAssertionFailed
                    (msg._M_dataplus._M_p,"CommitDescriptorSets",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
                     ,0x1b4);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)msg._M_dataplus._M_p != &msg.field_2) {
            operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
          }
          pVVar9 = (pDVar2->vkSets)._M_elems[0];
        }
        if (pVVar9 == (VkDescriptorSet_T *)0x0) goto LAB_001d3cca;
        uVar7 = pDVar2->BaseInd;
        uVar10 = uVar14 + uVar4;
        uVar6 = uVar14;
        if (uVar7 < uVar10) {
          FormatString<char[26],char[50]>
                    (&msg,(Diligent *)"Debug expression failed:\n",
                     (char (*) [26])"SetInfo.BaseInd >= FirstSetToBind + TotalSetCount",
                     (char (*) [50])in_RCX);
          DebugAssertionFailed
                    (msg._M_dataplus._M_p,"CommitDescriptorSets",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
                     ,0x1bb);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)msg._M_dataplus._M_p != &msg.field_2) {
            operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
          }
          uVar7 = pDVar2->BaseInd;
        }
        while (uVar10 < uVar7) {
          (this->m_DescriptorSets)._M_elems[uVar6] = (VkDescriptorSet_T *)0x0;
          uVar10 = uVar4 + uVar6 + 1;
          uVar6 = uVar6 + 1;
        }
        this_01 = (local_50->super_CommittedShaderResources).ResourceCaches._M_elems[local_64];
        if (this_01 == (ShaderResourceCacheVk *)0x0) {
          FormatString<char[33],unsigned_int,char[50]>
                    (&msg,(Diligent *)"Resource cache at binding index ",(char (*) [33])&local_64,
                     (uint *)" is null, but corresponding descriptor set is not",in_R8);
          DebugAssertionFailed
                    (msg._M_dataplus._M_p,"CommitDescriptorSets",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
                     ,0x1c0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)msg._M_dataplus._M_p != &msg.field_2) {
            operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
          }
        }
        BindInfo = local_50;
        in_RCX = (array<Diligent::DeviceContextVkImpl::ResourceBindInfo::DescriptorSetInfo,_8UL> *)
                 (ulong)uVar6;
        (this->m_DescriptorSets)._M_elems[(long)in_RCX] = (pDVar2->vkSets)._M_elems[0];
        pVVar9 = (pDVar2->vkSets)._M_elems[1];
        uVar14 = uVar6 + 1;
        if (pVVar9 != (VkDescriptorSet_T *)0x0) {
          uVar14 = uVar6 + 2;
          in_RCX = (array<Diligent::DeviceContextVkImpl::ResourceBindInfo::DescriptorSetInfo,_8UL> *
                   )(ulong)(uVar6 + 1);
          (this->m_DescriptorSets)._M_elems[(long)in_RCX] = pVVar9;
        }
        if ((ulong)pDVar2->DynamicOffsetCount != 0) {
          if ((ulong)((long)(this->m_DynamicBufferOffsets).
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_finish -
                      (long)(this->m_DynamicBufferOffsets).
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start >> 2) <
              (ulong)pDVar2->DynamicOffsetCount + ((ulong)local_60 & 0xffffffff)) {
            FormatString<char[87]>
                      (&msg,(char (*) [87])
                            "m_DynamicBufferOffsets must\'ve been resized by SetPipelineState() to have enough space"
                      );
            DebugAssertionFailed
                      (msg._M_dataplus._M_p,"CommitDescriptorSets",
                       "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
                       ,0x1c9);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)msg._M_dataplus._M_p != &msg.field_2) {
              operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
            }
          }
          Args_1 = local_60;
          UVar8 = ShaderResourceCacheVk::GetDynamicBufferOffsets
                            (this_01,this,local_40,(Uint32)local_60);
          if (UVar8 != pDVar2->DynamicOffsetCount) {
            FormatString<char[26],char[48]>
                      (&msg,(Diligent *)"Debug expression failed:\n",
                       (char (*) [26])"NumOffsetsWritten == SetInfo.DynamicOffsetCount",
                       (char (*) [48])Args_1);
            DebugAssertionFailed
                      (msg._M_dataplus._M_p,"CommitDescriptorSets",
                       "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
                       ,0x1cc);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)msg._M_dataplus._M_p != &msg.field_2) {
              operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
            }
            UVar8 = pDVar2->DynamicOffsetCount;
          }
          in_RCX = (array<Diligent::DeviceContextVkImpl::ResourceBindInfo::DescriptorSetInfo,_8UL> *
                   )(ulong)((int)local_60 + UVar8);
          local_60 = in_RCX;
        }
        pDVar2->LastBoundBaseInd = pDVar2->BaseInd;
      }
      uVar10 = local_64 + 1;
      local_64 = uVar10;
    } while (uVar10 <= (uint)local_58);
  }
  VVar12 = (this->m_State).vkPipelineBindPoint;
  if (VVar12 == VK_PIPELINE_BIND_POINT_MAX_ENUM) {
    FormatString<char[26],char[63]>
              (&msg,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"m_State.vkPipelineBindPoint != VK_PIPELINE_BIND_POINT_MAX_ENUM",
               (char (*) [63])in_RCX);
    in_RCX = (array<Diligent::DeviceContextVkImpl::ResourceBindInfo::DescriptorSetInfo,_8UL> *)0x1dd
    ;
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"CommitDescriptorSets",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
               ,0x1dd);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)msg._M_dataplus._M_p != &msg.field_2) {
      operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
    }
    VVar12 = (this->m_State).vkPipelineBindPoint;
  }
  puVar5 = (this->m_DynamicBufferOffsets).
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  pVVar13 = (this->m_CommandBuffer).m_VkCmdBuffer;
  pVVar11 = BindInfo->vkPipelineLayout;
  if (pVVar13 == (VkCommandBuffer)0x0) {
    local_58 = BindInfo->vkPipelineLayout;
    FormatString<char[26],char[32]>
              (&msg,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"m_VkCmdBuffer != VK_NULL_HANDLE",(char (*) [32])in_RCX);
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"BindDescriptorSets",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/include/VulkanUtilities/VulkanCommandBuffer.hpp"
               ,0x1f7);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)msg._M_dataplus._M_p != &msg.field_2) {
      operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
    }
    pVVar13 = (this->m_CommandBuffer).m_VkCmdBuffer;
    pVVar11 = local_58;
  }
  (*vkCmdBindDescriptorSets)
            (pVVar13,VVar12,pVVar11,uVar4,uVar14,(this->m_DescriptorSets)._M_elems,
             (uint32_t)local_60,puVar5);
  pSVar1 = &(BindInfo->super_CommittedShaderResources).StaleSRBMask;
  *pSVar1 = *pSVar1 & ~(BindInfo->super_CommittedShaderResources).ActiveSRBMask;
  return;
}

Assistant:

void DeviceContextVkImpl::CommitDescriptorSets(ResourceBindInfo& BindInfo, Uint32 CommitSRBMask)
{
    VERIFY(CommitSRBMask != 0, "This method should not be called when there is nothing to commit");

    const Uint32 FirstSign = PlatformMisc::GetLSB(CommitSRBMask);
    const Uint32 LastSign  = PlatformMisc::GetMSB(CommitSRBMask);
    VERIFY_EXPR(LastSign < m_pPipelineState->GetResourceSignatureCount());

    // Bind all descriptor sets in a single BindDescriptorSets call
    uint32_t     DynamicOffsetCount = 0;
    uint32_t     TotalSetCount      = 0;
    const Uint32 FirstSetToBind     = BindInfo.SetInfo[FirstSign].BaseInd;
    for (Uint32 sign = FirstSign; sign <= LastSign; ++sign)
    {
        ResourceBindInfo::DescriptorSetInfo& SetInfo = BindInfo.SetInfo[sign];
        VERIFY(SetInfo.vkSets[0] != VK_NULL_HANDLE || (CommitSRBMask & (1u << sign)) == 0,
               "At least one descriptor set in the stale SRB must not be NULL. Empty SRBs should not be marked as stale by CommitShaderResources()");

        VERIFY((BindInfo.ActiveSRBMask & (1u << sign)) != 0 || SetInfo.vkSets[0] == VK_NULL_HANDLE, "Descriptor sets must be null for inactive slots");
        if (SetInfo.vkSets[0] == VK_NULL_HANDLE)
        {
            VERIFY_EXPR(SetInfo.vkSets[1] == VK_NULL_HANDLE);
            continue;
        }

        VERIFY_EXPR(SetInfo.BaseInd >= FirstSetToBind + TotalSetCount);
        while (FirstSetToBind + TotalSetCount < SetInfo.BaseInd)
            m_DescriptorSets[TotalSetCount++] = VK_NULL_HANDLE;

        const ShaderResourceCacheVk* pResourceCache = BindInfo.ResourceCaches[sign];
        DEV_CHECK_ERR(pResourceCache != nullptr, "Resource cache at binding index ", sign, " is null, but corresponding descriptor set is not");

        m_DescriptorSets[TotalSetCount++] = SetInfo.vkSets[0];
        if (SetInfo.vkSets[1] != VK_NULL_HANDLE)
            m_DescriptorSets[TotalSetCount++] = SetInfo.vkSets[1];

        if (SetInfo.DynamicOffsetCount > 0)
        {
            VERIFY(m_DynamicBufferOffsets.size() >= size_t{DynamicOffsetCount} + size_t{SetInfo.DynamicOffsetCount},
                   "m_DynamicBufferOffsets must've been resized by SetPipelineState() to have enough space");

            Uint32 NumOffsetsWritten = pResourceCache->GetDynamicBufferOffsets(this, m_DynamicBufferOffsets, DynamicOffsetCount);
            VERIFY_EXPR(NumOffsetsWritten == SetInfo.DynamicOffsetCount);
            DynamicOffsetCount += SetInfo.DynamicOffsetCount;
        }

#ifdef DILIGENT_DEVELOPMENT
        SetInfo.LastBoundBaseInd = SetInfo.BaseInd;
#endif
    }

    // Note that there is one global dynamic buffer from which all dynamic resources are suballocated in Vulkan back-end,
    // and this buffer is not resizable, so the buffer handle can never change.

    // vkCmdBindDescriptorSets causes the sets numbered [firstSet .. firstSet+descriptorSetCount-1] to use the
    // bindings stored in pDescriptorSets[0 .. descriptorSetCount-1] for subsequent rendering commands
    // (either compute or graphics, according to the pipelineBindPoint). Any bindings that were previously
    // applied via these sets are no longer valid.
    // https://www.khronos.org/registry/vulkan/specs/1.3-extensions/man/html/vkCmdBindDescriptorSets.html
    VERIFY_EXPR(m_State.vkPipelineBindPoint != VK_PIPELINE_BIND_POINT_MAX_ENUM);
    m_CommandBuffer.BindDescriptorSets(m_State.vkPipelineBindPoint, BindInfo.vkPipelineLayout, FirstSetToBind, TotalSetCount,
                                       m_DescriptorSets.data(), DynamicOffsetCount, m_DynamicBufferOffsets.data());

    BindInfo.StaleSRBMask &= ~BindInfo.ActiveSRBMask;
}